

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_15(QPDF *pdf,char *arg2)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  BaseHandle *pBVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  BaseHandle BVar5;
  pointer pQVar6;
  char cVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  _IO_FILE *p_Var11;
  ulong uVar12;
  bool bVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_R8;
  pointer pQVar14;
  undefined8 uVar15;
  QPDFObjectHandle QVar16;
  QPDFObjectHandle QVar17;
  QPDFObjectHandle QVar18;
  QPDFObjectHandle QVar19;
  QPDFObjectHandle QVar20;
  QPDFObjectHandle QVar21;
  QPDFObjectHandle QVar22;
  QPDFObjectHandle QVar23;
  QPDFObjectHandle QVar24;
  QPDFObjectHandle QVar25;
  QPDFObjectHandle QVar26;
  QPDFObjectHandle QVar27;
  QPDFObjectHandle QVar28;
  QPDFObjectHandle QVar29;
  QPDFWriter w;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_pages;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> contents;
  QPDFObjectHandle page_template;
  string local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_178;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_130;
  undefined8 local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  _func_int **local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  _func_int **local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  undefined8 local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  _func_int **local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  _func_int **local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined8 local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  _func_int **local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _func_int **local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  undefined8 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long *local_38;
  
  plVar8 = (long *)QPDF::getAllPages();
  if (plVar8[1] - *plVar8 != 0xa0) {
    __assert_fail("pages.size() == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29a,"void test_15(QPDF &, const char *)");
  }
  local_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  cVar7 = QPDF::everPushedInheritedAttributesToPages();
  if (cVar7 != '\0') {
    __assert_fail("!pdf.everPushedInheritedAttributesToPages()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29b,"void test_15(QPDF &, const char *)");
  }
  local_48 = *(undefined8 *)(plVar8[1] + -0x10);
  local_40 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar8[1] + -8);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_48;
  QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_180._M_pi;
  QPDF::removePage(QVar16);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  cVar7 = QPDF::everPushedInheritedAttributesToPages();
  if (cVar7 == '\0') {
    __assert_fail("pdf.everPushedInheritedAttributesToPages()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29d,"void test_15(QPDF &, const char *)");
  }
  puVar1 = (undefined8 *)*plVar8;
  if (plVar8[1] - (long)puVar1 != 0x90) {
    __assert_fail("pages.size() == 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x29e,"void test_15(QPDF &, const char *)");
  }
  local_58 = *puVar1;
  local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_50->_M_use_count = local_50->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_50->_M_use_count = local_50->_M_use_count + 1;
    }
  }
  QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_58;
  QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_180._M_pi;
  QPDF::removePage(QVar17);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  lVar9 = *plVar8;
  if (plVar8[1] - lVar9 != 0x80) {
    __assert_fail("pages.size() == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x2a0,"void test_15(QPDF &, const char *)");
  }
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x48);
  BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> =
       ((BaseHandle *)(lVar9 + 0x40))->obj;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Original page 5","");
  checkPageContents((QPDFObjectHandle)
                    BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>,&local_1a8)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  lVar9 = *plVar8;
  uVar12 = plVar8[1] - lVar9 >> 4;
  if (uVar12 < 5) {
    uVar15 = 4;
LAB_0011983d:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15,
               uVar12);
LAB_00119844:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00119856:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00119868:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    local_68 = *(undefined8 *)(lVar9 + 0x40);
    local_60 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x48);
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_60->_M_use_count = local_60->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_60->_M_use_count = local_60->_M_use_count + 1;
      }
    }
    QVar18.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_68;
    QVar18.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_180._M_pi;
    QPDF::removePage(QVar18);
    if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
    lVar9 = *plVar8;
    if (plVar8[1] - lVar9 != 0x70) {
      __assert_fail("pages.size() == 7",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x2a3,"void test_15(QPDF &, const char *)");
    }
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x48);
    BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> =
         ((BaseHandle *)(lVar9 + 0x40))->obj;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Original page 6","");
    checkPageContents((QPDFObjectHandle)
                      BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>,
                      &local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    pBVar3 = (BaseHandle *)*plVar8;
    if ((BaseHandle *)plVar8[1] == pBVar3) {
      uVar15 = 0;
      uVar12 = 0;
      goto LAB_0011983d;
    }
    _Var4._M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&pBVar3->obj + 8))->_M_pi;
    BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> = pBVar3->obj;
    if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
      }
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Original page 1","");
    checkPageContents((QPDFObjectHandle)
                      BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>,
                      &local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    }
    lVar9 = *plVar8;
    uVar12 = plVar8[1] - lVar9 >> 4;
    if (uVar12 < 7) {
      uVar15 = 6;
      goto LAB_0011983d;
    }
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x68);
    BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> =
         ((BaseHandle *)(lVar9 + 0x60))->obj;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Original page 8","");
    checkPageContents((QPDFObjectHandle)
                      BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>,
                      &local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    local_158.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"New page 1","");
    createPageContents((QPDF *)&local_178,(string *)local_180._M_pi);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
              (&local_158,(QPDFObjectHandle *)&local_178);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"New page 0","");
    createPageContents((QPDF *)&local_178,(string *)local_180._M_pi);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
              (&local_158,(QPDFObjectHandle *)&local_178);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"New page 5","");
    createPageContents((QPDF *)&local_178,(string *)local_180._M_pi);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
              (&local_158,(QPDFObjectHandle *)&local_178);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"New page 6","");
    createPageContents((QPDF *)&local_178,(string *)local_180._M_pi);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
              (&local_158,(QPDFObjectHandle *)&local_178);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"New page 11","");
    createPageContents((QPDF *)&local_178,(string *)local_180._M_pi);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
              (&local_158,(QPDFObjectHandle *)&local_178);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"New page 12","");
    createPageContents((QPDF *)&local_178,(string *)local_180._M_pi);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
              (&local_158,(QPDFObjectHandle *)&local_178);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    pQVar6 = local_158.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar1 = (undefined8 *)*plVar8;
    if ((undefined8 *)plVar8[1] == puVar1) goto LAB_00119844;
    local_78 = *puVar1;
    local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_70->_M_use_count = local_70->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_70->_M_use_count = local_70->_M_use_count + 1;
      }
    }
    local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38 = plVar8;
    if (local_158.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_158.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00119752:
      uVar15 = 0;
      uVar12 = 0;
LAB_00119a1e:
      uVar15 = std::__throw_out_of_range_fmt
                         ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          ,uVar15,uVar12);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_178);
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_158);
      _Unwind_Resume(uVar15);
    }
    bVar13 = true;
    pQVar14 = local_158.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      QPDFObjectHandle::shallowCopy();
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"/Contents","");
      QPDFObjectHandle::replaceKey((string *)&local_138,(QPDFObjectHandle *)&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar13) {
        local_88 = local_138;
        local_80 = p_Stack_130;
        if (p_Stack_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_130->_M_use_count = p_Stack_130->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_130->_M_use_count = p_Stack_130->_M_use_count + 1;
          }
        }
        QVar19.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_180._M_pi;
        QVar19.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_1a8;
        QPDF::makeIndirectObject(QVar19);
        p_Var2 = p_Stack_130;
        p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length;
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p;
        local_1a8._M_dataplus._M_p = (pointer)0x0;
        local_1a8._M_string_length = 0;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._M_string_length);
          }
        }
        if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
        }
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                (&local_178,(value_type *)&local_138);
      if (p_Stack_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_130);
      }
      plVar8 = local_38;
      pQVar14 = pQVar14 + 1;
      bVar13 = false;
    } while (pQVar14 != pQVar6);
    if (local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_00119752;
    local_98 = *(_func_int ***)
                &(local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start)->super_BaseHandle;
    local_90 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)local_178.
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start + 8);
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_90->_M_use_count = local_90->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_90->_M_use_count = local_90->_M_use_count + 1;
      }
    }
    QVar20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_98;
    QVar20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_180._M_pi;
    QPDF::addPage(QVar20,true);
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
    }
    pBVar3 = (BaseHandle *)*plVar8;
    if ((BaseHandle *)plVar8[1] == pBVar3) goto LAB_00119752;
    _Var4._M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&pBVar3->obj + 8))->_M_pi;
    BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> = pBVar3->obj;
    if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
      }
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"New page 1","");
    checkPageContents((QPDFObjectHandle)
                      BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>,
                      &local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    }
    uVar12 = (long)local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    uVar15 = 1;
    if (uVar12 < 2) goto LAB_00119a1e;
    local_a8 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
    local_a0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1))->_M_use_count;
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_a0->_M_use_count = local_a0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_a0->_M_use_count = local_a0->_M_use_count + 1;
      }
    }
    puVar1 = (undefined8 *)*plVar8;
    if ((undefined8 *)plVar8[1] == puVar1) goto LAB_00119856;
    local_b8 = *puVar1;
    local_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_b0->_M_use_count = local_b0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_b0->_M_use_count = local_b0->_M_use_count + 1;
      }
    }
    QVar21.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_a8;
    QVar21.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_180._M_pi;
    QVar26.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = in_R8._M_pi;
    QVar26.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_b8;
    QPDF::addPageAt(QVar21,true,QVar26);
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
    if (plVar8[1] == *plVar8) goto LAB_00119868;
    lVar9 = QPDFObjectHandle::getObjGen();
    if (1 < (ulong)((long)local_178.
                          super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_178.
                          super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 4)) {
      lVar10 = QPDFObjectHandle::getObjGen();
      if (lVar9 != lVar10) goto LAB_0011988d;
      uVar12 = (long)local_178.
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)local_178.
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                     .super__Vector_impl_data._M_start >> 4;
      if (uVar12 < 3) {
        uVar15 = 2;
        goto LAB_00119a1e;
      }
      local_c8 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (local_178.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start + 2))->_vptr__Sp_counted_base;
      local_c0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (local_178.
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_start + 2))->_M_use_count;
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_c0->_M_use_count = local_c0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_c0->_M_use_count = local_c0->_M_use_count + 1;
        }
      }
      lVar9 = *plVar8;
      if ((ulong)(plVar8[1] - lVar9 >> 4) < 6) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",5);
LAB_001198ca:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",5);
      }
      else {
        local_d8 = *(undefined8 *)(lVar9 + 0x50);
        local_d0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x58);
        if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_d0->_M_use_count = local_d0->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_d0->_M_use_count = local_d0->_M_use_count + 1;
          }
        }
        QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_c8;
        QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_180._M_pi;
        QVar27.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = in_R8._M_pi;
        QVar27.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_d8;
        QPDF::addPageAt(QVar22,true,QVar27);
        if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
        }
        if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
        }
        if ((ulong)(plVar8[1] - *plVar8 >> 4) < 6) goto LAB_001198ca;
        lVar9 = QPDFObjectHandle::getObjGen();
        if (2 < (ulong)((long)local_178.
                              super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_178.
                              super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4)) {
          lVar10 = QPDFObjectHandle::getObjGen();
          if (lVar9 != lVar10) goto LAB_001198f0;
          uVar12 = (long)local_178.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_178.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4;
          if (uVar12 < 4) {
            uVar15 = 3;
            goto LAB_00119a1e;
          }
          local_e8 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (local_178.
                      super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                      _M_impl.super__Vector_impl_data._M_start + 3))->_vptr__Sp_counted_base;
          local_e0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                      &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       (local_178.
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_start + 3))->_M_use_count;
          if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_e0->_M_use_count = local_e0->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_e0->_M_use_count = local_e0->_M_use_count + 1;
            }
          }
          lVar9 = *plVar8;
          if ((ulong)(plVar8[1] - lVar9 >> 4) < 6) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",5
                      );
LAB_0011992d:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",6
                      );
          }
          else {
            local_f8 = *(undefined8 *)(lVar9 + 0x50);
            local_f0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x58);
            if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_f0->_M_use_count = local_f0->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_f0->_M_use_count = local_f0->_M_use_count + 1;
              }
            }
            QVar23.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_e8;
            QVar23.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)local_180._M_pi;
            QVar28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = in_R8._M_pi;
            QVar28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)&local_f8;
            QPDF::addPageAt(QVar23,false,QVar28);
            if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
            }
            if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
            }
            if ((ulong)(plVar8[1] - *plVar8 >> 4) < 7) goto LAB_0011992d;
            lVar9 = QPDFObjectHandle::getObjGen();
            if (3 < (ulong)((long)local_178.
                                  super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_178.
                                  super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4)) {
              lVar10 = QPDFObjectHandle::getObjGen();
              if (lVar9 != lVar10) goto LAB_00119953;
              if (plVar8[1] - *plVar8 != 0xb0) {
                __assert_fail("pages.size() == 11",
                              "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                              ,0x2d1,"void test_15(QPDF &, const char *)");
              }
              uVar12 = (long)local_178.
                             super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_178.
                             super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4;
              if (4 < uVar12) {
                local_108 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (local_178.
                             super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4))->_vptr__Sp_counted_base
                ;
                local_100 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                             &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              (local_178.
                               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                               ._M_impl.super__Vector_impl_data._M_start + 4))->_M_use_count;
                if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_100->_M_use_count = local_100->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_100->_M_use_count = local_100->_M_use_count + 1;
                  }
                }
                QVar24.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_108;
                QVar24.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)local_180._M_pi;
                QPDF::addPage(QVar24,false);
                if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
                }
                if ((ulong)(plVar8[1] - *plVar8 >> 4) < 0xc) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0xb);
                }
                else {
                  lVar9 = QPDFObjectHandle::getObjGen();
                  if (4 < (ulong)((long)local_178.
                                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_178.
                                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4)) {
                    lVar10 = QPDFObjectHandle::getObjGen();
                    if (lVar9 == lVar10) {
                      uVar12 = (long)local_178.
                                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_178.
                                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4;
                      if (uVar12 < 6) {
                        uVar15 = 5;
                      }
                      else {
                        local_118 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                    (local_178.
                                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 5))->
                                    _vptr__Sp_counted_base;
                        local_110 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      (local_178.
                                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 5))->_M_use_count
                        ;
                        if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_110->_M_use_count = local_110->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_110->_M_use_count = local_110->_M_use_count + 1;
                          }
                        }
                        local_128 = *(undefined8 *)(plVar8[1] + -0x10);
                        local_120 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                     (plVar8[1] + -8);
                        if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_120->_M_use_count = local_120->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_120->_M_use_count = local_120->_M_use_count + 1;
                          }
                        }
                        QVar25.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_118;
                        QVar25.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)local_180._M_pi;
                        QVar29.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                             = in_R8._M_pi;
                        QVar29.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)&local_128;
                        QPDF::addPageAt(QVar25,false,QVar29);
                        if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
                        }
                        if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
                        }
                        pBVar3 = (BaseHandle *)*plVar8;
                        if (plVar8[1] - (long)pBVar3 != 0xd0) {
                          __assert_fail("pages.size() == 13",
                                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                                        ,0x2d5,"void test_15(QPDF &, const char *)");
                        }
                        _Var4._M_pi = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                      ((long)&pBVar3->obj + 8))->_M_pi;
                        BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> =
                             pBVar3->obj;
                        if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
                          }
                        }
                        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_1a8,"New page 0","");
                        checkPageContents((QPDFObjectHandle)
                                          BVar5.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ,&local_1a8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                          operator_delete(local_1a8._M_dataplus._M_p,
                                          local_1a8.field_2._M_allocated_capacity + 1);
                        }
                        if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi)
                          ;
                        }
                        lVar9 = *plVar8;
                        uVar12 = plVar8[1] - lVar9 >> 4;
                        if (1 < uVar12) {
                          p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x18);
                          BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> =
                               ((BaseHandle *)(lVar9 + 0x10))->obj;
                          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                            }
                          }
                          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_1a8,"New page 1","");
                          checkPageContents((QPDFObjectHandle)
                                            BVar5.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ,&local_1a8);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                            operator_delete(local_1a8._M_dataplus._M_p,
                                            local_1a8.field_2._M_allocated_capacity + 1);
                          }
                          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
                          }
                          lVar9 = *plVar8;
                          uVar12 = plVar8[1] - lVar9 >> 4;
                          uVar15 = 5;
                          if (5 < uVar12) {
                            p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                      (lVar9 + 0x58);
                            BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> =
                                 ((BaseHandle *)(lVar9 + 0x50))->obj;
                            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                              }
                            }
                            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_1a8,"New page 5","");
                            checkPageContents((QPDFObjectHandle)
                                              BVar5.obj.
                                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                              ,&local_1a8);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                              operator_delete(local_1a8._M_dataplus._M_p,
                                              local_1a8.field_2._M_allocated_capacity + 1);
                            }
                            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
                            }
                            lVar9 = *plVar8;
                            uVar12 = plVar8[1] - lVar9 >> 4;
                            if (uVar12 < 7) {
                              uVar15 = 6;
                            }
                            else {
                              p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                        (lVar9 + 0x68);
                              BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> =
                                   ((BaseHandle *)(lVar9 + 0x60))->obj;
                              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                }
                              }
                              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_1a8,"New page 6","");
                              checkPageContents((QPDFObjectHandle)
                                                BVar5.obj.
                                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                ,&local_1a8);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                operator_delete(local_1a8._M_dataplus._M_p,
                                                local_1a8.field_2._M_allocated_capacity + 1);
                              }
                              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (p_Var2);
                              }
                              lVar9 = *plVar8;
                              uVar12 = plVar8[1] - lVar9 >> 4;
                              if (uVar12 < 0xc) {
                                uVar15 = 0xb;
                              }
                              else {
                                p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                          (lVar9 + 0xb8);
                                BVar5.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                     = ((BaseHandle *)(lVar9 + 0xb0))->obj;
                                if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                  }
                                }
                                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_1a8,"New page 11","");
                                checkPageContents((QPDFObjectHandle)
                                                  BVar5.obj.
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ,&local_1a8);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                  operator_delete(local_1a8._M_dataplus._M_p,
                                                  local_1a8.field_2._M_allocated_capacity + 1);
                                }
                                if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (p_Var2);
                                }
                                lVar9 = *plVar8;
                                uVar12 = plVar8[1] - lVar9 >> 4;
                                if (0xc < uVar12) {
                                  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                            (lVar9 + 200);
                                  BVar5.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> =
                                       ((BaseHandle *)(lVar9 + 0xc0))->obj;
                                  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                  {
                                    if (__libc_single_threaded == '\0') {
                                      LOCK();
                                      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                      UNLOCK();
                                    }
                                    else {
                                      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                                    }
                                  }
                                  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_1a8,"New page 12","");
                                  checkPageContents((QPDFObjectHandle)
                                                    BVar5.obj.
                                                                                                        
                                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                  ,&local_1a8);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                                    operator_delete(local_1a8._M_dataplus._M_p,
                                                    local_1a8.field_2._M_allocated_capacity + 1);
                                  }
                                  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                  {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              (p_Var2);
                                  }
                                  p_Var11 = (_IO_FILE *)QUtil::safe_fopen("a.pdf","wb");
                                  QPDFWriter::QPDFWriter
                                            ((QPDFWriter *)&local_1a8,(QPDF *)local_180._M_pi,
                                             "FILE* a.pdf",p_Var11,true);
                                  QPDFWriter::setStaticID(SUB81(&local_1a8,0));
                                  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&local_1a8);
                                  QPDFWriter::write();
                                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      local_1a8._M_string_length !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                               local_1a8._M_string_length);
                                  }
                                  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
                                  ~vector(&local_178);
                                  if (local_70 !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              (local_70);
                                  }
                                  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
                                  ~vector(&local_158);
                                  return;
                                }
                                uVar15 = 0xc;
                              }
                            }
                          }
                        }
                      }
                      goto LAB_00119a1e;
                    }
                    goto LAB_001199c2;
                  }
                }
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,4);
LAB_001199c2:
                __assert_fail("pages.at(11).getObjGen() == new_pages.at(4).getObjGen()",
                              "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                              ,0x2d3,"void test_15(QPDF &, const char *)");
              }
              uVar15 = 4;
              goto LAB_00119a1e;
            }
          }
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
LAB_00119953:
          __assert_fail("pages.at(6).getObjGen() == new_pages.at(3).getObjGen()",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x2d0,"void test_15(QPDF &, const char *)");
        }
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
LAB_001198f0:
      __assert_fail("pages.at(5).getObjGen() == new_pages.at(2).getObjGen()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x2ce,"void test_15(QPDF &, const char *)");
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_0011988d:
  __assert_fail("pages.at(0).getObjGen() == new_pages.at(1).getObjGen()",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x2cc,"void test_15(QPDF &, const char *)");
}

Assistant:

static void
test_15(QPDF& pdf, char const* arg2)
{
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();
    // Reference to original page numbers for this test case are
    // numbered from 0.

    // Remove pages from various places, checking to make sure
    // that our pages reference is getting updated.
    assert(pages.size() == 10);
    assert(!pdf.everPushedInheritedAttributesToPages());
    pdf.removePage(pages.back()); // original page 9
    assert(pdf.everPushedInheritedAttributesToPages());
    assert(pages.size() == 9);
    pdf.removePage(*pages.begin()); // original page 0
    assert(pages.size() == 8);
    checkPageContents(pages.at(4), "Original page 5");
    pdf.removePage(pages.at(4)); // original page 5
    assert(pages.size() == 7);
    checkPageContents(pages.at(4), "Original page 6");
    checkPageContents(pages.at(0), "Original page 1");
    checkPageContents(pages.at(6), "Original page 8");

    // Insert pages

    // Create some content streams.
    std::vector<QPDFObjectHandle> contents;
    contents.push_back(createPageContents(pdf, "New page 1"));
    contents.push_back(createPageContents(pdf, "New page 0"));
    contents.push_back(createPageContents(pdf, "New page 5"));
    contents.push_back(createPageContents(pdf, "New page 6"));
    contents.push_back(createPageContents(pdf, "New page 11"));
    contents.push_back(createPageContents(pdf, "New page 12"));

    // Create some page objects.  Start with an existing
    // dictionary and modify it.  Using the results of
    // getDictAsMap to create a new dictionary effectively creates
    // a shallow copy.
    QPDFObjectHandle page_template = pages.at(0);
    std::vector<QPDFObjectHandle> new_pages;
    bool first = true;
    for (auto const& iter: contents) {
        // We will retain indirect object references to other
        // indirect objects other than page content.
        QPDFObjectHandle page = page_template.shallowCopy();
        page.replaceKey("/Contents", iter);
        if (first) {
            // leave direct
            first = false;
        } else {
            page = pdf.makeIndirectObject(page);
        }
        new_pages.push_back(page);
    }

    // Now insert the pages
    pdf.addPage(new_pages.at(0), true);
    checkPageContents(pages.at(0), "New page 1");
    pdf.addPageAt(new_pages.at(1), true, pages.at(0));
    assert(pages.at(0).getObjGen() == new_pages.at(1).getObjGen());
    pdf.addPageAt(new_pages.at(2), true, pages.at(5));
    assert(pages.at(5).getObjGen() == new_pages.at(2).getObjGen());
    pdf.addPageAt(new_pages.at(3), false, pages.at(5));
    assert(pages.at(6).getObjGen() == new_pages.at(3).getObjGen());
    assert(pages.size() == 11);
    pdf.addPage(new_pages.at(4), false);
    assert(pages.at(11).getObjGen() == new_pages.at(4).getObjGen());
    pdf.addPageAt(new_pages.at(5), false, pages.back());
    assert(pages.size() == 13);
    checkPageContents(pages.at(0), "New page 0");
    checkPageContents(pages.at(1), "New page 1");
    checkPageContents(pages.at(5), "New page 5");
    checkPageContents(pages.at(6), "New page 6");
    checkPageContents(pages.at(11), "New page 11");
    checkPageContents(pages.at(12), "New page 12");

    // Exercise writing to FILE*
    FILE* out = QUtil::safe_fopen("a.pdf", "wb");
    QPDFWriter w(pdf, "FILE* a.pdf", out, true);
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}